

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# focus.cpp
# Opt level: O0

vector<cppurses::Widget_*,_std::allocator<cppurses::Widget_*>_> *
anon_unknown.dwarf_197fb::gen_focus_front_widg_tree(void)

{
  bool bVar1;
  Widget *pWVar2;
  iterator __first;
  vector<cppurses::Widget_*,_std::allocator<cppurses::Widget_*>_> *in_RDI;
  __normal_iterator<cppurses::Widget_**,_std::vector<cppurses::Widget_*,_std::allocator<cppurses::Widget_*>_>_>
  local_68;
  __normal_iterator<cppurses::Widget_**,_std::vector<cppurses::Widget_*,_std::allocator<cppurses::Widget_*>_>_>
  iter;
  iterator end;
  iterator begin;
  Widget *focus_widg;
  Widget *local_40 [3];
  __normal_iterator<cppurses::Widget_**,_std::vector<cppurses::Widget_*,_std::allocator<cppurses::Widget_*>_>_>
  local_28;
  const_iterator local_20;
  undefined1 local_11;
  vector<cppurses::Widget_*,_std::allocator<cppurses::Widget_*>_> *widg_tree;
  
  local_11 = 0;
  pWVar2 = cppurses::System::head();
  cppurses::Children_data::get_descendants(in_RDI,&pWVar2->children);
  local_28._M_current =
       (Widget **)
       std::begin<std::vector<cppurses::Widget*,std::allocator<cppurses::Widget*>>>(in_RDI);
  __gnu_cxx::
  __normal_iterator<cppurses::Widget*const*,std::vector<cppurses::Widget*,std::allocator<cppurses::Widget*>>>
  ::__normal_iterator<cppurses::Widget**>
            ((__normal_iterator<cppurses::Widget*const*,std::vector<cppurses::Widget*,std::allocator<cppurses::Widget*>>>
              *)&local_20,&local_28);
  local_40[0] = cppurses::System::head();
  std::vector<cppurses::Widget_*,_std::allocator<cppurses::Widget_*>_>::insert
            (in_RDI,local_20,local_40);
  begin._M_current = (Widget **)cppurses::Focus::focus_widget();
  if ((Widget *)begin._M_current != (Widget *)0x0) {
    __first = std::begin<std::vector<cppurses::Widget*,std::allocator<cppurses::Widget*>>>(in_RDI);
    iter._M_current =
         (Widget **)
         std::end<std::vector<cppurses::Widget*,std::allocator<cppurses::Widget*>>>(in_RDI);
    local_68 = std::
               find<__gnu_cxx::__normal_iterator<cppurses::Widget**,std::vector<cppurses::Widget*,std::allocator<cppurses::Widget*>>>,cppurses::Widget*>
                         (__first._M_current,iter,(Widget **)&begin);
    bVar1 = __gnu_cxx::operator!=(&local_68,&iter);
    if (bVar1) {
      std::_V2::
      rotate<__gnu_cxx::__normal_iterator<cppurses::Widget**,std::vector<cppurses::Widget*,std::allocator<cppurses::Widget*>>>>
                ((__normal_iterator<cppurses::Widget_**,_std::vector<cppurses::Widget_*,_std::allocator<cppurses::Widget_*>_>_>
                  )__first._M_current,local_68,iter);
    }
  }
  return in_RDI;
}

Assistant:

auto gen_focus_front_widg_tree()
{
    auto widg_tree = System::head()->children.get_descendants();
    widg_tree.insert(std::begin(widg_tree), System::head());
    auto* const focus_widg = Focus::focus_widget();
    if (focus_widg != nullptr) {
        const auto begin = std::begin(widg_tree);
        const auto end   = std::end(widg_tree);
        const auto iter  = std::find(begin, end, focus_widg);
        if (iter != end)
            std::rotate(begin, iter, end);
    }
    return widg_tree;
}